

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

opj_pi_iterator_t * opj_pi_create_decode(opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no)

{
  OPJ_PROG_ORDER OVar1;
  opj_tcp_t *poVar2;
  opj_pi_resolution_t *poVar3;
  OPJ_UINT32 *pOVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 **ptr;
  OPJ_UINT32 **p_resolutions;
  opj_pi_iterator_t *p_pi;
  ulong uVar6;
  OPJ_INT16 *pOVar7;
  OPJ_UINT32 OVar8;
  OPJ_UINT32 **ppOVar9;
  long lVar10;
  OPJ_BOOL *pOVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  opj_pi_comp_t *poVar16;
  opj_pi_iterator_t *poVar17;
  opj_image_comp_t *poVar18;
  opj_poc_t *poVar19;
  bool bVar20;
  OPJ_INT32 l_ty1;
  OPJ_INT32 l_ty0;
  OPJ_INT32 l_tx1;
  OPJ_INT32 l_tx0;
  opj_image_comp_t *local_50;
  ulong local_48;
  OPJ_UINT32 l_dy_min;
  OPJ_UINT32 l_dx_min;
  OPJ_UINT32 l_max_prec;
  OPJ_UINT32 l_max_res;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x56a,
                  "opj_pi_iterator_t *opj_pi_create_decode(opj_image_t *, opj_cp_t *, OPJ_UINT32)");
  }
  if (p_image == (opj_image_t *)0x0) {
    __assert_fail("p_image != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x56b,
                  "opj_pi_iterator_t *opj_pi_create_decode(opj_image_t *, opj_cp_t *, OPJ_UINT32)");
  }
  if (p_cp->th * p_cp->tw <= p_tile_no) {
    __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x56c,
                  "opj_pi_iterator_t *opj_pi_create_decode(opj_image_t *, opj_cp_t *, OPJ_UINT32)");
  }
  uVar13 = p_image->numcomps;
  uVar12 = (ulong)uVar13;
  poVar2 = p_cp->tcps;
  local_48 = (ulong)poVar2[p_tile_no].numpocs;
  ptr = (OPJ_UINT32 **)opj_malloc((ulong)(uVar13 * 0x84) << 2);
  if (ptr != (OPJ_UINT32 **)0x0) {
    p_resolutions = (OPJ_UINT32 **)opj_malloc(uVar12 * 8);
    if (p_resolutions != (OPJ_UINT32 **)0x0) {
      p_pi = opj_pi_create(p_image,p_cp,p_tile_no);
      if (p_pi != (opj_pi_iterator_t *)0x0) {
        if (uVar12 != 0) {
          uVar6 = 0;
          ppOVar9 = ptr;
          do {
            p_resolutions[uVar6] = (OPJ_UINT32 *)ppOVar9;
            ppOVar9 = ppOVar9 + 0x42;
            uVar6 = uVar6 + 1;
          } while (uVar12 != uVar6);
        }
        opj_get_all_encoding_parameters
                  (p_image,p_cp,p_tile_no,&l_tx0,&l_tx1,&l_ty0,&l_ty1,&l_dx_min,&l_dy_min,
                   &l_max_prec,&l_max_res,p_resolutions);
        OVar5 = l_max_prec * uVar13;
        uVar13 = l_max_res * OVar5;
        p_pi->include = (OPJ_INT16 *)0x0;
        uVar14 = poVar2[p_tile_no].numlayers + 1;
        if ((int)((ulong)uVar14 * (ulong)uVar13 >> 0x20) == 0) {
          uVar14 = uVar14 * uVar13;
          p_pi->include_size = uVar14;
          pOVar7 = (OPJ_INT16 *)opj_calloc((ulong)uVar14,2);
          p_pi->include = pOVar7;
        }
        uVar14 = (int)local_48 + 1;
        if (p_pi->include == (OPJ_INT16 *)0x0) {
          opj_free(ptr);
          opj_free(p_resolutions);
          opj_pi_destroy(p_pi,uVar14);
          return (opj_pi_iterator_t *)0x0;
        }
        poVar16 = p_pi->comps;
        local_50 = p_image->comps;
        p_pi->tx0 = l_tx0;
        p_pi->ty0 = l_ty0;
        p_pi->tx1 = l_tx1;
        p_pi->ty1 = l_ty1;
        p_pi->step_p = 1;
        p_pi->step_c = l_max_prec;
        p_pi->step_r = OVar5;
        p_pi->step_l = uVar13;
        if (uVar12 != 0) {
          uVar6 = 0;
          poVar18 = local_50;
          do {
            poVar3 = poVar16->resolutions;
            pOVar4 = p_resolutions[uVar6];
            poVar16->dx = poVar18->dx;
            poVar16->dy = poVar18->dy;
            OVar8 = poVar16->numresolutions;
            if (OVar8 != 0) {
              lVar10 = 0;
              do {
                *(undefined4 *)((long)&poVar3->pdx + lVar10) =
                     *(undefined4 *)((long)pOVar4 + lVar10);
                *(undefined4 *)((long)&poVar3->pdy + lVar10) =
                     *(undefined4 *)((long)pOVar4 + lVar10 + 4);
                *(undefined4 *)((long)&poVar3->pw + lVar10) =
                     *(undefined4 *)((long)pOVar4 + lVar10 + 8);
                *(undefined4 *)((long)&poVar3->ph + lVar10) =
                     *(undefined4 *)((long)pOVar4 + lVar10 + 0xc);
                lVar10 = lVar10 + 0x10;
                OVar8 = OVar8 - 1;
              } while (OVar8 != 0);
            }
            poVar16 = poVar16 + 1;
            poVar18 = poVar18 + 1;
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar12);
        }
        if (1 < uVar14) {
          poVar17 = p_pi;
          iVar15 = 1;
          do {
            poVar16 = poVar17[1].comps;
            poVar17[1].tx0 = l_tx0;
            poVar17[1].ty0 = l_ty0;
            poVar17[1].tx1 = l_tx1;
            poVar17[1].ty1 = l_ty1;
            poVar17[1].step_p = 1;
            poVar17[1].step_c = l_max_prec;
            poVar17[1].step_r = OVar5;
            poVar17[1].step_l = uVar13;
            if (uVar12 != 0) {
              uVar6 = 0;
              poVar18 = local_50;
              do {
                poVar3 = poVar16->resolutions;
                pOVar4 = p_resolutions[uVar6];
                poVar16->dx = poVar18->dx;
                poVar16->dy = poVar18->dy;
                OVar8 = poVar16->numresolutions;
                if (OVar8 != 0) {
                  lVar10 = 0;
                  do {
                    *(undefined4 *)((long)&poVar3->pdx + lVar10) =
                         *(undefined4 *)((long)pOVar4 + lVar10);
                    *(undefined4 *)((long)&poVar3->pdy + lVar10) =
                         *(undefined4 *)((long)pOVar4 + lVar10 + 4);
                    *(undefined4 *)((long)&poVar3->pw + lVar10) =
                         *(undefined4 *)((long)pOVar4 + lVar10 + 8);
                    *(undefined4 *)((long)&poVar3->ph + lVar10) =
                         *(undefined4 *)((long)pOVar4 + lVar10 + 0xc);
                    lVar10 = lVar10 + 0x10;
                    OVar8 = OVar8 - 1;
                  } while (OVar8 != 0);
                }
                poVar16 = poVar16 + 1;
                poVar18 = poVar18 + 1;
                uVar6 = uVar6 + 1;
              } while (uVar6 != uVar12);
            }
            poVar17[1].include = poVar17->include;
            poVar17[1].include_size = poVar17->include_size;
            poVar17 = poVar17 + 1;
            bVar20 = iVar15 != (int)local_48;
            iVar15 = iVar15 + 1;
          } while (bVar20);
        }
        opj_free(ptr);
        opj_free(p_resolutions);
        if ((poVar2[p_tile_no].field_0x1638 & 4) == 0) {
          if (poVar2 == (opj_tcp_t *)0x0) {
            __assert_fail("p_tcp != 00",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/pi.c"
                          ,0x4d8,
                          "void opj_pi_update_decode_not_poc(opj_pi_iterator_t *, opj_tcp_t *, OPJ_UINT32, OPJ_UINT32)"
                         );
          }
          if (poVar2[p_tile_no].numpocs != 0xffffffff) {
            OVar1 = poVar2[p_tile_no].prg;
            OVar5 = poVar2[p_tile_no].numlayers;
            pOVar11 = &p_pi->first;
            iVar15 = poVar2[p_tile_no].numpocs + 1;
            do {
              pOVar11[10] = OVar1;
              *(undefined8 *)pOVar11 = 1;
              pOVar11[2] = 0;
              *(undefined8 *)(pOVar11 + 6) = 0;
              pOVar11[4] = l_max_res;
              pOVar11[5] = pOVar11[0x26];
              pOVar11[3] = OVar5;
              pOVar11[8] = l_max_prec;
              pOVar11 = pOVar11 + 0x3e;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
            return p_pi;
          }
          return p_pi;
        }
        if (poVar2 == (opj_tcp_t *)0x0) {
          __assert_fail("p_tcp != 00",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/pi.c"
                        ,0x4ae,
                        "void opj_pi_update_decode_poc(opj_pi_iterator_t *, opj_tcp_t *, OPJ_UINT32, OPJ_UINT32)"
                       );
        }
        if (poVar2[p_tile_no].numpocs != 0xffffffff) {
          uVar13 = poVar2[p_tile_no].numlayers;
          poVar19 = poVar2[p_tile_no].pocs;
          pOVar11 = &p_pi->first;
          iVar15 = poVar2[p_tile_no].numpocs + 1;
          do {
            pOVar11[10] = poVar19->prg;
            *pOVar11 = 1;
            ((opj_poc_t *)(pOVar11 + 1))->resno0 = poVar19->resno0;
            pOVar11[2] = poVar19->compno0;
            *(undefined8 *)(pOVar11 + 6) = 0;
            pOVar11[4] = poVar19->resno1;
            pOVar11[5] = poVar19->compno1;
            uVar14 = poVar19->layno1;
            if (uVar13 <= poVar19->layno1) {
              uVar14 = uVar13;
            }
            pOVar11[3] = uVar14;
            pOVar11[8] = l_max_prec;
            poVar19 = poVar19 + 1;
            pOVar11 = pOVar11 + 0x3e;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
          return p_pi;
        }
        return p_pi;
      }
      opj_free(ptr);
      ptr = p_resolutions;
    }
    opj_free(ptr);
  }
  return (opj_pi_iterator_t *)0x0;
}

Assistant:

opj_pi_iterator_t *opj_pi_create_decode(opj_image_t *p_image,
                                        opj_cp_t *p_cp,
                                        OPJ_UINT32 p_tile_no)
{
    OPJ_UINT32 numcomps = p_image->numcomps;

    /* loop */
    OPJ_UINT32 pino;
    OPJ_UINT32 compno, resno;

    /* to store w, h, dx and dy fro all components and resolutions */
    OPJ_UINT32 * l_tmp_data;
    OPJ_UINT32 ** l_tmp_ptr;

    /* encoding prameters to set */
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_INT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;
    OPJ_UINT32 l_bound;
    OPJ_UINT32 l_step_p, l_step_c, l_step_r, l_step_l ;
    OPJ_UINT32 l_data_stride;

    /* pointers */
    opj_pi_iterator_t *l_pi = 00;
    opj_tcp_t *l_tcp = 00;
    const opj_tccp_t *l_tccp = 00;
    opj_pi_comp_t *l_current_comp = 00;
    opj_image_comp_t * l_img_comp = 00;
    opj_pi_iterator_t * l_current_pi = 00;
    OPJ_UINT32 * l_encoding_value_ptr = 00;

    /* preconditions in debug */
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    /* initializations */
    l_tcp = &p_cp->tcps[p_tile_no];
    l_bound = l_tcp->numpocs + 1;

    l_data_stride = 4 * OPJ_J2K_MAXRLVLS;
    l_tmp_data = (OPJ_UINT32*)opj_malloc(
                     l_data_stride * numcomps * sizeof(OPJ_UINT32));
    if
    (! l_tmp_data) {
        return 00;
    }
    l_tmp_ptr = (OPJ_UINT32**)opj_malloc(
                    numcomps * sizeof(OPJ_UINT32 *));
    if
    (! l_tmp_ptr) {
        opj_free(l_tmp_data);
        return 00;
    }

    /* memory allocation for pi */
    l_pi = opj_pi_create(p_image, p_cp, p_tile_no);
    if (!l_pi) {
        opj_free(l_tmp_data);
        opj_free(l_tmp_ptr);
        return 00;
    }

    l_encoding_value_ptr = l_tmp_data;
    /* update pointer array */
    for
    (compno = 0; compno < numcomps; ++compno) {
        l_tmp_ptr[compno] = l_encoding_value_ptr;
        l_encoding_value_ptr += l_data_stride;
    }
    /* get encoding parameters */
    opj_get_all_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1,
                                    &l_ty0, &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res, l_tmp_ptr);

    /* step calculations */
    l_step_p = 1;
    l_step_c = l_max_prec * l_step_p;
    l_step_r = numcomps * l_step_c;
    l_step_l = l_max_res * l_step_r;

    /* set values for first packet iterator */
    l_current_pi = l_pi;

    /* memory allocation for include */
    /* prevent an integer overflow issue */
    /* 0 < l_tcp->numlayers < 65536 c.f. opj_j2k_read_cod in j2k.c */
    l_current_pi->include = 00;
    if (l_step_l <= (UINT_MAX / (l_tcp->numlayers + 1U))) {
        l_current_pi->include_size = (l_tcp->numlayers + 1U) * l_step_l;
        l_current_pi->include = (OPJ_INT16*) opj_calloc(
                                    l_current_pi->include_size, sizeof(OPJ_INT16));
    }

    if (!l_current_pi->include) {
        opj_free(l_tmp_data);
        opj_free(l_tmp_ptr);
        opj_pi_destroy(l_pi, l_bound);
        return 00;
    }

    /* special treatment for the first packet iterator */
    l_current_comp = l_current_pi->comps;
    l_img_comp = p_image->comps;
    l_tccp = l_tcp->tccps;

    l_current_pi->tx0 = l_tx0;
    l_current_pi->ty0 = l_ty0;
    l_current_pi->tx1 = l_tx1;
    l_current_pi->ty1 = l_ty1;

    /*l_current_pi->dx = l_img_comp->dx;*/
    /*l_current_pi->dy = l_img_comp->dy;*/

    l_current_pi->step_p = l_step_p;
    l_current_pi->step_c = l_step_c;
    l_current_pi->step_r = l_step_r;
    l_current_pi->step_l = l_step_l;

    /* allocation for components and number of components has already been calculated by opj_pi_create */
    for
    (compno = 0; compno < numcomps; ++compno) {
        opj_pi_resolution_t *l_res = l_current_comp->resolutions;
        l_encoding_value_ptr = l_tmp_ptr[compno];

        l_current_comp->dx = l_img_comp->dx;
        l_current_comp->dy = l_img_comp->dy;
        /* resolutions have already been initialized */
        for
        (resno = 0; resno < l_current_comp->numresolutions; resno++) {
            l_res->pdx = *(l_encoding_value_ptr++);
            l_res->pdy = *(l_encoding_value_ptr++);
            l_res->pw =  *(l_encoding_value_ptr++);
            l_res->ph =  *(l_encoding_value_ptr++);
            ++l_res;
        }
        ++l_current_comp;
        ++l_img_comp;
        ++l_tccp;
    }
    ++l_current_pi;

    for (pino = 1 ; pino < l_bound ; ++pino) {
        l_current_comp = l_current_pi->comps;
        l_img_comp = p_image->comps;
        l_tccp = l_tcp->tccps;

        l_current_pi->tx0 = l_tx0;
        l_current_pi->ty0 = l_ty0;
        l_current_pi->tx1 = l_tx1;
        l_current_pi->ty1 = l_ty1;
        /*l_current_pi->dx = l_dx_min;*/
        /*l_current_pi->dy = l_dy_min;*/
        l_current_pi->step_p = l_step_p;
        l_current_pi->step_c = l_step_c;
        l_current_pi->step_r = l_step_r;
        l_current_pi->step_l = l_step_l;

        /* allocation for components and number of components has already been calculated by opj_pi_create */
        for
        (compno = 0; compno < numcomps; ++compno) {
            opj_pi_resolution_t *l_res = l_current_comp->resolutions;
            l_encoding_value_ptr = l_tmp_ptr[compno];

            l_current_comp->dx = l_img_comp->dx;
            l_current_comp->dy = l_img_comp->dy;
            /* resolutions have already been initialized */
            for
            (resno = 0; resno < l_current_comp->numresolutions; resno++) {
                l_res->pdx = *(l_encoding_value_ptr++);
                l_res->pdy = *(l_encoding_value_ptr++);
                l_res->pw =  *(l_encoding_value_ptr++);
                l_res->ph =  *(l_encoding_value_ptr++);
                ++l_res;
            }
            ++l_current_comp;
            ++l_img_comp;
            ++l_tccp;
        }
        /* special treatment*/
        l_current_pi->include = (l_current_pi - 1)->include;
        l_current_pi->include_size = (l_current_pi - 1)->include_size;
        ++l_current_pi;
    }
    opj_free(l_tmp_data);
    l_tmp_data = 00;
    opj_free(l_tmp_ptr);
    l_tmp_ptr = 00;
    if
    (l_tcp->POC) {
        opj_pi_update_decode_poc(l_pi, l_tcp, l_max_prec, l_max_res);
    } else {
        opj_pi_update_decode_not_poc(l_pi, l_tcp, l_max_prec, l_max_res);
    }
    return l_pi;
}